

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_get(Table *t,TValue *key)

{
  int iVar1;
  TValue *pTVar2;
  lua_Integer local_58;
  lua_Integer k_1;
  TValue *key_local;
  Table *t_local;
  int local_34;
  TKey *pTStack_30;
  int nx;
  TValue *k;
  Node *n;
  Table *local_18;
  Table *local_10;
  
  k_1 = (lua_Integer)key;
  key_local = (TValue *)t;
  switch(key->tt_ & 0x7f) {
  case 0:
    t_local = (Table *)&luaO_nilobject_;
    break;
  case 3:
    iVar1 = luaV_tointeger(key,&local_58,F2Ieq);
    if (iVar1 != 0) {
      pTVar2 = luaH_getint((Table *)key_local,local_58);
      return pTVar2;
    }
  default:
    t_local = (Table *)getgeneric((Table *)key_local,(TValue *)k_1);
    break;
  case 4:
    if ((key->tt_ & 0xf) != 4) {
      __assert_fail("(((((((key))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2ba,"const TValue *luaH_get(Table *, const TValue *)");
    }
    if ((((key->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((key)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2ba,"const TValue *luaH_get(Table *, const TValue *)");
    }
    n = (Node *)(key->value_).gc;
    k = &t->node[*(uint *)&(n->i_val).field_0xc & t->hmask].i_val;
    local_18 = t;
    if ((lu_byte)(n->i_val).tt_ != '\x04') {
      __assert_fail("key->tt == ((4) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    pTStack_30 = (TKey *)&((Table *)k)->array;
    if (*(short *)&((Table *)k)->node == -0x7ffc) {
      if (((ulong)((Table *)k)->node & 0xf) != 4) {
        __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      if ((((pTStack_30->nk).value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      if (((pTStack_30->nk).value_.gc)->tt != '\x04') {
        __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      if (((ulong)((Table *)k)->node & 0xf) != 4) {
        __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      if ((((pTStack_30->nk).value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      local_10 = (Table *)k;
      if ((Node *)(pTStack_30->nk).value_.gc != n) goto LAB_0013ea5f;
    }
    else {
LAB_0013ea5f:
      local_34 = *(int *)((long)&((Table *)k)->node + 4);
      if (local_34 == 0) {
        local_10 = (Table *)&luaO_nilobject_;
      }
      else {
        local_10 = (Table *)luaH_getshortstr_continue((TString *)n,(Node *)k);
      }
    }
    t_local = local_10;
    break;
  case 0x13:
    if (key->tt_ != 0x13) {
      __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,699,"const TValue *luaH_get(Table *, const TValue *)");
    }
    t_local = (Table *)luaH_getint(t,(key->value_).i);
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_get(Table *t, const TValue *key) {
#if 1
  switch (ttype(key)) {
    case LUA_TSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_TNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TNUMFLT: {
      lua_Integer k;
      if (luaV_tointeger(key, &k, 0)) /* index is int? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key);
  }
#else
  int tt = ttype(key);
  if (RAVI_LIKELY(tt == LUA_TNUMINT))
    return luaH_getint(t, ivalue(key));
  else if (tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, tsvalue(key));
  else if (tt == LUA_TNIL)
    return luaO_nilobject;
  else if (tt == LUA_TNUMFLT) {
    lua_Integer k;
    if (luaV_tointeger(key, &k, 0)) /* index is int? */
      return luaH_getint(t, k);     /* use specialized version */
    /* else... */
    return getgeneric(t, key);
  } /* FALLTHROUGH */
  else {
    return getgeneric(t, key);
  }
#endif
}